

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

int __thiscall nv::ColorBlock::init(ColorBlock *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar5;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  int in_ECX;
  uint in_EDX;
  uint local_44;
  int bx;
  uint e;
  int by;
  uint i;
  uint local_30;
  uint local_2c;
  uint bh;
  uint local_24;
  int local_20;
  uint bw;
  uint y_local;
  uint x_local;
  Image *img_local;
  ColorBlock *this_local;
  
  local_20 = in_ECX;
  bw = in_EDX;
  _y_local = (Image *)ctx;
  img_local = (Image *)this;
  uVar2 = Image::width((Image *)ctx);
  bh = uVar2 - bw;
  local_2c = 4;
  puVar4 = min<unsigned_int>(&bh,&local_2c);
  local_24 = *puVar4;
  uVar2 = Image::height(_y_local);
  i = uVar2 - local_20;
  by = 4;
  puVar4 = min<unsigned_int>(&i,(uint *)&by);
  uVar3 = *puVar4;
  e = 0;
  local_30 = uVar3;
  while (e < 4) {
    iVar1 = init::remainder[(local_30 - 1) * 4 + e];
    for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
      paVar5 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
               Image::pixel(_y_local,bw + init::remainder[(local_24 - 1) * 4 + local_44],
                            local_20 + iVar1);
      paVar6 = &color(this,local_44,e)->field_0;
      paVar6->field_0 = *paVar5;
    }
    uVar3 = e + 1;
    e = uVar3;
  }
  return uVar3;
}

Assistant:

void ColorBlock::init(const Image * img, uint x, uint y)
{
	nvDebugCheck(img != NULL);
	
	const uint bw = min(img->width() - x, 4U);
	const uint bh = min(img->height() - y, 4U);

	nvDebugCheck(bw != 0);
	nvDebugCheck(bh != 0);

	static int remainder[] = {
		0, 0, 0, 0,
		0, 1, 0, 1,
		0, 1, 2, 0,
		0, 1, 2, 3,
	};

	// Blocks that are smaller than 4x4 are handled by repeating the pixels.
	// @@ Thats only correct when block size is 1, 2 or 4, but not with 3. :(

	for(uint i = 0; i < 4; i++) {
		//const int by = i % bh;
		const int by = remainder[(bh - 1) * 4 + i];
		for(uint e = 0; e < 4; e++) {
			//const int bx = e % bw;
			const int bx = remainder[(bw - 1) * 4 + e];
			color(e, i) = img->pixel(x + bx, y + by);
		}
	}
}